

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O2

void __thiscall
Json_StringAndIteratorAPI_Test::Json_StringAndIteratorAPI_Test(Json_StringAndIteratorAPI_Test *this)

{
  anon_unknown.dwarf_b7c4f::Json::Json(&this->super_Json);
  (this->super_Json).super_Test._vptr_Test = (_func_int **)&PTR__Test_001aaac8;
  return;
}

Assistant:

TEST_F (Json, StringAndIteratorAPI) {
    std::string const src = "null";
    {
        json::parser<json_out_callbacks> p1;
        std::string const res = p1.input (src).eof ();
        EXPECT_FALSE (p1.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p1.coordinate (), (json::coord{5U, 1U}));
    }
    {
        json::parser<json_out_callbacks> p2;
        std::string const res = p2.input (std::begin (src), std::end (src)).eof ();
        EXPECT_FALSE (p2.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p2.coordinate (), (json::coord{5U, 1U}));
    }
}